

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  uint uVar1;
  U32 UVar2;
  char acVar3 [4];
  int iVar4;
  long lVar5;
  int local_88;
  uint local_84;
  int count;
  int max;
  uint n0;
  size_t countSize;
  char buffer [4];
  int previous0;
  uint charnum;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int nbBits;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  size_t hbSize_local;
  void *headerBuffer_local;
  uint *tableLogPtr_local;
  uint *maxSVPtr_local;
  short *normalizedCounter_local;
  
  lVar5 = (long)headerBuffer + hbSize;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  countSize._4_4_ = 0;
  if (hbSize < 4) {
    memset(&countSize,0,4);
    memcpy(&countSize,headerBuffer,hbSize);
    normalizedCounter_local =
         (short *)FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,&countSize,4);
    uVar1 = FSE_isError((size_t)normalizedCounter_local);
    if ((uVar1 == 0) && (hbSize < normalizedCounter_local)) {
      normalizedCounter_local = (short *)0xffffffffffffffec;
    }
  }
  else {
    if (hbSize < 4) {
      __assert_fail("hbSize >= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x9f2,
                    "size_t FSE_readNCount(short *, unsigned int *, unsigned int *, const void *, size_t)"
                   );
    }
    memset(normalizedCounter,0,(ulong)(*maxSVPtr + 1) << 1);
    UVar2 = MEM_readLE32(headerBuffer);
    uVar1 = (UVar2 & 0xf) + 5;
    if (uVar1 < 0x10) {
      charnum = UVar2 >> 4;
      previous0 = 4;
      *tableLogPtr = uVar1;
      bitStream = (1 << (sbyte)uVar1) + 1;
      bitCount = 1 << (sbyte)uVar1;
      threshold = (UVar2 & 0xf) + 6;
      _remaining = headerBuffer;
      while (1 < (int)bitStream && (uint)buffer <= *maxSVPtr) {
        if (countSize._4_4_ != 0) {
          count._0_1_ = buffer[0];
          count._1_1_ = buffer[1];
          count._2_1_ = buffer[2];
          count._3_1_ = buffer[3];
          while ((charnum & 0xffff) == 0xffff) {
            count = count + 0x18;
            if (_remaining < (void *)(lVar5 + -5)) {
              _remaining = (void *)((long)_remaining + 2);
              UVar2 = MEM_readLE32(_remaining);
              charnum = UVar2 >> ((byte)previous0 & 0x1f);
            }
            else {
              charnum = charnum >> 0x10;
              previous0 = previous0 + 0x10;
            }
          }
          for (; (charnum & 3) == 3; charnum = charnum >> 2) {
            count = count + 3;
            previous0 = previous0 + 2;
          }
          acVar3 = (char  [4])((charnum & 3) + count);
          previous0 = previous0 + 2;
          if (*maxSVPtr < (uint)acVar3) {
            return 0xffffffffffffffd0;
          }
          while ((uint)buffer < (uint)acVar3) {
            normalizedCounter[(uint)buffer] = 0;
            buffer = (char  [4])((int)buffer + 1);
          }
          iVar4 = previous0 >> 3;
          if (((void *)(lVar5 + -7) < _remaining) &&
             (lVar5 - 4U < (ulong)((long)_remaining + (long)iVar4))) {
            charnum = charnum >> 2;
          }
          else {
            if (3 < iVar4) {
              __assert_fail("(bitCount >> 3) <= 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0xa16,
                            "size_t FSE_readNCount(short *, unsigned int *, unsigned int *, const void *, size_t)"
                           );
            }
            _remaining = (void *)((long)_remaining + (long)iVar4);
            previous0 = previous0 & 7;
            UVar2 = MEM_readLE32(_remaining);
            charnum = UVar2 >> (sbyte)previous0;
          }
        }
        uVar1 = (bitCount * 2 + -1) - bitStream;
        if ((charnum & bitCount - 1U) < uVar1) {
          local_84 = charnum & bitCount - 1U;
          iVar4 = threshold + -1;
        }
        else {
          local_84 = charnum & bitCount * 2 - 1U;
          iVar4 = threshold;
          if (bitCount <= (int)local_84) {
            local_84 = local_84 - uVar1;
          }
        }
        previous0 = iVar4 + previous0;
        iVar4 = local_84 - 1;
        local_88 = iVar4;
        if (iVar4 < 0) {
          local_88 = -iVar4;
        }
        bitStream = bitStream - local_88;
        normalizedCounter[(uint)buffer] = (short)iVar4;
        countSize._4_4_ = (uint)((iVar4 != 0 ^ 0xffU) & 1);
        for (; (int)bitStream < bitCount; bitCount = bitCount >> 1) {
          threshold = threshold + -1;
        }
        if (((void *)(lVar5 + -7) < _remaining) &&
           (lVar5 - 4U < (ulong)((long)_remaining + (long)(previous0 >> 3)))) {
          previous0 = previous0 + (((int)lVar5 + -4) - (int)_remaining) * -8;
          _remaining = (void *)(lVar5 + -4);
        }
        else {
          _remaining = (void *)((long)_remaining + (long)(previous0 >> 3));
          previous0 = previous0 & 7;
        }
        buffer = (char  [4])((int)buffer + 1);
        UVar2 = MEM_readLE32(_remaining);
        charnum = UVar2 >> ((byte)previous0 & 0x1f);
      }
      if (bitStream == 1) {
        if (previous0 < 0x21) {
          *maxSVPtr = (int)buffer - 1;
          normalizedCounter_local =
               (short *)((long)_remaining + ((long)(previous0 + 7 >> 3) - (long)headerBuffer));
        }
        else {
          normalizedCounter_local = (short *)0xffffffffffffffec;
        }
      }
      else {
        normalizedCounter_local = (short *)0xffffffffffffffec;
      }
    }
    else {
      normalizedCounter_local = (short *)0xffffffffffffffd4;
    }
  }
  return (size_t)normalizedCounter_local;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    /* init */
    memset(normalizedCounter, 0, (*maxSVPtr+1) * sizeof(normalizedCounter[0]));   /* all symbols not present in NCount have a frequency of 0 */
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}